

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O3

void GetTopRightScreenSize(int *outLeft,int *outTop,int *outRight,int *outBottom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  rm_b = 0;
  rm_r = 0;
  rm_t = 0;
  rm_l = 0;
  XPLMGetAllMonitorBoundsGlobal(CBRightTopMostMonitorGlobal,0);
  iVar3 = rm_b;
  iVar2 = rm_t;
  iVar1 = rm_r;
  if (((rm_l != 0 || rm_t != 0) || rm_r != 0) || rm_b != 0) {
    *outLeft = rm_l;
    *outTop = iVar2;
    *outRight = iVar1;
    *outBottom = iVar3;
    return;
  }
  *outBottom = 0;
  *outLeft = 0;
  XPLMGetScreenSize(outRight,outTop);
  return;
}

Assistant:

void GetTopRightScreenSize (int& outLeft,
                            int& outTop,
                            int& outRight,
                            int& outBottom)
{
    // find window coordinates
    // this will only find full screen monitors!
    rm_l = rm_t = rm_r = rm_b = 0;
    rm_idx = INT_MAX;
    
    // fetch global bounds of X-Plane-used windows
    XPLMGetAllMonitorBoundsGlobal (CBRightTopMostMonitorGlobal, NULL);
    
    // did we find something? then return it
    if ( rm_l || rm_t || rm_r || rm_b ) {
        outLeft     = rm_l;
        outTop      = rm_t;
        outRight    = rm_r;
        outBottom   = rm_b;
        return;
    }
    
    // if we didn't find anything we are running in windowed mode
    outLeft = outBottom = 0;
    XPLMGetScreenSize(&outRight,&outTop);
}